

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O3

void board_free(Board *board)

{
  ulong uVar1;
  
  if ((board->gameState != (void *)0x0) &&
     ((gConfig.game)->freeGameState != (_func_void_Board_ptr *)0x0)) {
    (*(gConfig.game)->freeGameState)(board);
  }
  if (board->spotsCount != '\0') {
    uVar1 = 0;
    do {
      spot_free(board->spots[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < board->spotsCount);
  }
  free(board->spots);
  free(board);
  return;
}

Assistant:

void board_free(Board * board)
{
	unsigned char i;
	if(board->gameState!=0 && gConfig.game->freeGameState!=0)
		gConfig.game->freeGameState(board);

	for(i=0;i<board->spotsCount;i++)
	{
		spot_free(board->spots[i]);
	}
	free(board->spots);
	free(board);
}